

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitTupleExtract
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          TupleExtract *curr)

{
  ulong uVar1;
  Flow *pFVar2;
  undefined1 local_80 [8];
  Flow flow;
  
  visit((Flow *)local_80,this,curr->tuple);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    uVar1 = (ulong)curr->index;
    if ((ulong)((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_start -
                      flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) /
                0x18 + (long)local_80) <= uVar1) {
      __assert_fail("flow.values.size() > curr->index",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x5d1,
                    "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitTupleExtract(TupleExtract *) [SubType = wasm::ModuleRunner]"
                   );
    }
    pFVar2 = (Flow *)((flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id -
                      0x18) + uVar1 * 0x18);
    if (uVar1 == 0) {
      pFVar2 = &flow;
    }
    ::wasm::Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)pFVar2);
    Flow::Flow(__return_storage_ptr__,(Literal *)&flow.breakTo.super_IString.str._M_str);
    ::wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_80);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTupleExtract(TupleExtract* curr) {
    NOTE_ENTER("tuple.extract");
    Flow flow = visit(curr->tuple);
    if (flow.breaking()) {
      return flow;
    }
    assert(flow.values.size() > curr->index);
    return Flow(flow.values[curr->index]);
  }